

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdso_support.cc
# Opt level: O0

void * __thiscall
absl::lts_20250127::debugging_internal::VDSOSupport::SetBase(VDSOSupport *this,void *base)

{
  __pointer_type pvVar1;
  void *old_base;
  char *absl_raw_log_internal_basename;
  void *base_local;
  VDSOSupport *this_local;
  
  if ((undefined4 *)base != &ElfMemImage::kInvalidBaseSentinel) {
    pvVar1 = std::atomic<const_void_*>::load
                       ((atomic<const_void_*> *)&vdso_base_,memory_order_relaxed);
    std::atomic<const_void_*>::store((atomic<const_void_*> *)&vdso_base_,base,memory_order_relaxed);
    ElfMemImage::Init(&this->image_,base);
    std::atomic<long_(*)(unsigned_int_*,_void_*,_void_*)>::store
              ((atomic<long_(*)(unsigned_int_*,_void_*,_void_*)> *)&getcpu_fn_,InitAndGetCPU,
               memory_order_relaxed);
    return pvVar1;
  }
  raw_log_internal::RawLog
            (kFatal,"vdso_support.cc",0x93,"Check %s failed: %s",
             "base != debugging_internal::ElfMemImage::kInvalidBase","internal error");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/debugging/internal/vdso_support.cc"
                ,0x93,"const void *absl::debugging_internal::VDSOSupport::SetBase(const void *)");
}

Assistant:

const void *VDSOSupport::SetBase(const void *base) {
  ABSL_RAW_CHECK(base != debugging_internal::ElfMemImage::kInvalidBase,
                 "internal error");
  const void *old_base = vdso_base_.load(std::memory_order_relaxed);
  vdso_base_.store(base, std::memory_order_relaxed);
  image_.Init(base);
  // Also reset getcpu_fn_, so GetCPU could be tested with simulated VDSO.
  getcpu_fn_.store(&InitAndGetCPU, std::memory_order_relaxed);
  return old_base;
}